

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

int opn2_playFormat(OPN2_MIDIPlayer *device,int sampleCount,OPN2_UInt8 *out_left,
                   OPN2_UInt8 *out_right,OPNMIDI_AudioFormat *format)

{
  OPNMIDI_AudioFormat *format_local;
  OPN2_UInt8 *out_right_local;
  OPN2_UInt8 *out_left_local;
  int sampleCount_local;
  OPN2_MIDIPlayer *device_local;
  
  return 0;
}

Assistant:

OPNMIDI_EXPORT int opn2_playFormat(OPN2_MIDIPlayer *device, int sampleCount,
                                   OPN2_UInt8 *out_left, OPN2_UInt8 *out_right,
                                   const OPNMIDI_AudioFormat *format)
{
#if defined(OPNMIDI_DISABLE_MIDI_SEQUENCER)
    ADL_UNUSED(device);
    ADL_UNUSED(sampleCount);
    ADL_UNUSED(out_left);
    ADL_UNUSED(out_right);
    ADL_UNUSED(format);
    return 0;
#endif

#ifndef OPNMIDI_DISABLE_MIDI_SEQUENCER
    sampleCount -= sampleCount % 2; //Avoid even sample requests
    if(sampleCount < 0)
        return 0;
    if(!device)
        return 0;

    MidiPlayer *player = GET_MIDI_PLAYER(device);
    assert(player);
    MidiPlayer::Setup &setup = player->m_setup;

    ssize_t gotten_len = 0;
    ssize_t n_periodCountStereo = 512;
    //ssize_t n_periodCountPhys = n_periodCountStereo * 2;
    int left = sampleCount;
    bool hasSkipped = setup.tick_skip_samples_delay > 0;

    while(left > 0)
    {
        const double eat_delay = setup.delay < setup.maxdelay ? setup.delay : setup.maxdelay;
        if(hasSkipped)
        {
            size_t samples = setup.tick_skip_samples_delay > sampleCount ? sampleCount : setup.tick_skip_samples_delay;
            n_periodCountStereo = samples / 2;
        }
        else
        {
            setup.delay -= eat_delay;
            setup.carry += double(setup.PCM_RATE) * eat_delay;
            n_periodCountStereo = static_cast<ssize_t>(setup.carry);
            setup.carry -= double(n_periodCountStereo);
        }

        //if(setup.SkipForward > 0)
        //    setup.SkipForward -= 1;
        //else
        {
            if((player->m_sequencer->positionAtEnd()) && (setup.delay <= 0.0))
                break;//Stop to fetch samples at reaching the song end with disabled loop

            ssize_t leftSamples = left / 2;
            if(n_periodCountStereo > leftSamples)
            {
                setup.tick_skip_samples_delay = (n_periodCountStereo - leftSamples) * 2;
                n_periodCountStereo = leftSamples;
            }
            //! Count of stereo samples
            ssize_t in_generatedStereo = (n_periodCountStereo > 512) ? 512 : n_periodCountStereo;
            //! Total count of samples
            ssize_t in_generatedPhys = in_generatedStereo * 2;
            //! Unsigned total sample count
            //fill buffer with zeros
            int32_t *out_buf = player->m_outBuf;
            std::memset(out_buf, 0, static_cast<size_t>(in_generatedPhys) * sizeof(out_buf[0]));
            Synth &synth = *player->m_synth;
            unsigned int chips = synth.m_numChips;
            if(chips == 1)
                synth.m_chips[0]->generate32(out_buf, (size_t)in_generatedStereo);
            else/* if(n_periodCountStereo > 0)*/
            {
                /* Generate data from every chip and mix result */
                for(size_t card = 0; card < chips; ++card)
                    synth.m_chips[card]->generateAndMix32(out_buf, (size_t)in_generatedStereo);
            }
            /* Process it */
            if(SendStereoAudio(sampleCount, in_generatedStereo, out_buf, gotten_len, out_left, out_right, format) == -1)
                return 0;

            left -= (int)in_generatedPhys;
            gotten_len += (in_generatedPhys) /* - setup.stored_samples*/;
        }
        if(hasSkipped)
        {
            setup.tick_skip_samples_delay -= n_periodCountStereo * 2;
            hasSkipped = setup.tick_skip_samples_delay > 0;
        }
        else
            setup.delay = player->Tick(eat_delay, setup.mindelay);
    }

    return static_cast<int>(gotten_len);
#endif //OPNMIDI_DISABLE_MIDI_SEQUENCER
}